

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

char * __thiscall CTcTokenizer::store_source(CTcTokenizer *this,char *txt,size_t len)

{
  char *__dest;
  char *pcVar1;
  
  reserve_source(this,len);
  __dest = this->src_ptr_;
  memcpy(__dest,txt,len);
  pcVar1 = this->src_ptr_;
  this->src_ptr_ = pcVar1 + len;
  this->src_rem_ = this->src_rem_ - len;
  pcVar1[len] = '\0';
  this->src_ptr_ = this->src_ptr_ + 1;
  this->src_rem_ = this->src_rem_ - 1;
  return __dest;
}

Assistant:

const char *CTcTokenizer::store_source(const char *txt, size_t len)
{
    /* reserve space for the text */
    reserve_source(len);

    /* store it */
    const char *p = store_source_partial(txt, len);

    /* add a null terminator */
    static const char nt[1] = { '\0' };
    store_source_partial(nt, 1);

    /* return the pointer to the stored space */
    return p;
}